

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.hpp
# Opt level: O2

void __thiscall deqp::ub::StructType::~StructType(StructType *this)

{
  std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>::~vector
            (&this->m_members);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~StructType(void)
	{
	}